

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::DataManWriter::BeginStep(DataManWriter *this,StepMode mode,float timeout_sec)

{
  long *in_RDI;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffee4;
  size_t in_stack_ffffffffffffff08;
  DataManMonitor *in_stack_ffffffffffffff10;
  allocator *paVar3;
  allocator *__val;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  allocator local_91;
  string in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  in_RDI[0x2b] = in_RDI[0x2b] + 1;
  if ((int)in_RDI[0x24] == 0) {
    adios2::format::DataManSerializer::NewWriterBuffer
              ((DataManSerializer *)in_stack_ffffffffffffff40.__r,(size_t)in_stack_ffffffffffffff38)
    ;
  }
  if ((*(byte *)(in_RDI + 0x23) & 1) != 0) {
    DataManMonitor::BeginStep(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Engine",&local_31);
  __val = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"DataManWriter",__val);
  paVar3 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,"BeginStep",paVar3);
  (**(code **)(*in_RDI + 0x20))();
  std::__cxx11::to_string((unsigned_long)__val);
  helper::Comm::Rank((Comm *)0xe3ca96);
  uVar2 = *(undefined4 *)((long)in_RDI + 0xec);
  uVar1 = 5;
  helper::Log(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
              (string *)in_stack_ffffffffffffff40.__r,in_stack_ffffffffffffff38,
              in_stack_ffffffffffffff30.__d.__r._4_4_,(int)in_stack_ffffffffffffff30.__d.__r,
              in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,(LogMode)in_stack_ffffffffffffff70
             );
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::chrono::_V2::system_clock::now();
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&stack0xffffffffffffff30);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffffedc,uVar1));
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
            ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffff40);
  adios2::format::DataManSerializer::AttachTimeStamp
            ((DataManSerializer *)CONCAT44(in_stack_fffffffffffffee4,uVar2),
             CONCAT44(in_stack_fffffffffffffedc,uVar1));
  return OK;
}

Assistant:

StepStatus DataManWriter::BeginStep(StepMode mode, const float timeout_sec)
{
    ++m_CurrentStep;
    if (m_CombinedSteps == 0)
    {
        m_Serializer.NewWriterBuffer(m_SerializerBufferSize);
    }

    if (m_MonitorActive)
    {
        m_Monitor.BeginStep(m_CurrentStep);
    }

    helper::Log("Engine", "DataManWriter", "BeginStep", std::to_string(CurrentStep()), 0,
                m_Comm.Rank(), 5, m_Verbosity, helper::LogMode::INFO);

    m_Serializer.AttachTimeStamp(std::chrono::duration_cast<std::chrono::milliseconds>(
                                     std::chrono::system_clock::now().time_since_epoch())
                                     .count());

    return StepStatus::OK;
}